

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::TextureViewTestGetTexParameter::iterate(TextureViewTestGetTexParameter *this)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  ContextInfo *pCVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  MessageBuilder *pMVar8;
  TestError *this_00;
  NotSupportedError *this_01;
  pointer value;
  float fVar9;
  float fVar10;
  GLfloat query_texture_immutable_levels_value_float;
  GLint query_texture_view_num_levels_value_int;
  GLfloat query_texture_view_num_levels_value_float;
  GLint query_texture_view_num_layers_value_int;
  GLfloat query_texture_view_num_layers_value_float;
  GLint query_texture_view_min_level_value_int;
  GLfloat query_texture_view_min_level_value_float;
  GLint query_texture_view_min_layer_value_int;
  GLfloat query_texture_view_min_layer_value_float;
  GLint query_texture_immutable_levels_value_int;
  undefined1 local_1b0 [384];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  pCVar3 = ((this->super_TestCase).m_context)->m_contextInfo;
  _Var7 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                    ((pCVar3->m_extensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pCVar3->m_extensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"GL_ARB_texture_view");
  if (_Var7._M_current ==
      (pCVar3->m_extensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"GL_ARB_texture_view is not supported",
               (allocator<char> *)&query_texture_immutable_levels_value_float);
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b0);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTestRuns(this);
  value = (this->m_test_runs).
          super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
          ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (value == (this->m_test_runs).
                 super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    query_texture_immutable_levels_value_int = -1;
    query_texture_view_min_layer_value_int = -1;
    query_texture_immutable_levels_value_float = -1.0;
    query_texture_view_min_level_value_int = -1;
    query_texture_view_min_layer_value_float = -1.0;
    query_texture_view_num_layers_value_int = -1;
    query_texture_view_min_level_value_float = -1.0;
    query_texture_view_num_levels_value_int = -1;
    query_texture_view_num_layers_value_float = -1.0;
    query_texture_view_num_levels_value_float = -1.0;
    if (4 < (ulong)value->texture_type) break;
    (**(code **)(lVar6 + 0xb8))
              (value->texture_target,
               *(undefined4 *)
                ((long)&value->expected_n_immutable_levels +
                *(long *)(&DAT_016ecda8 + (ulong)value->texture_type * 8)));
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glBindTexture() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc14);
    (**(code **)(lVar6 + 0xac8))
              (value->texture_target,0x82df,&query_texture_immutable_levels_value_float);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetTexParameterfv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc19);
    (**(code **)(lVar6 + 0xad0))
              (value->texture_target,0x82df,&query_texture_immutable_levels_value_int);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetTexPrameteriv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc1d);
    (**(code **)(lVar6 + 0xac8))
              (value->texture_target,0x82dd,&query_texture_view_min_layer_value_float);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetTexParameterfv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc21);
    (**(code **)(lVar6 + 0xad0))
              (value->texture_target,0x82dd,&query_texture_view_min_layer_value_int);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc25);
    (**(code **)(lVar6 + 0xac8))
              (value->texture_target,0x82db,&query_texture_view_min_level_value_float);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetTexParameterfv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc29);
    (**(code **)(lVar6 + 0xad0))
              (value->texture_target,0x82db,&query_texture_view_min_level_value_int);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc2d);
    (**(code **)(lVar6 + 0xac8))
              (value->texture_target,0x82de,&query_texture_view_num_layers_value_float);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetTexParameterfv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc31);
    (**(code **)(lVar6 + 0xad0))
              (value->texture_target,0x82de,&query_texture_view_num_layers_value_int);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc35);
    (**(code **)(lVar6 + 0xac8))
              (value->texture_target,0x82dc,&query_texture_view_num_levels_value_float);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetTexParameterfv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc39);
    (**(code **)(lVar6 + 0xad0))
              (value->texture_target,0x82dc,&query_texture_view_num_levels_value_int);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc3d);
    fVar10 = query_texture_immutable_levels_value_float - (float)value->expected_n_immutable_levels;
    fVar9 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar9 = fVar10;
    }
    if (1e-05 < fVar9) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Invalid floating-point value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname "
                     );
      std::operator<<((ostream *)poVar2,"(expected: ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&value->expected_n_immutable_levels);
      poVar1 = &pMVar8->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," found: ");
      std::ostream::operator<<(poVar1,query_texture_immutable_levels_value_float);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid FP value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc4a);
      goto LAB_00aa61a4;
    }
    if (query_texture_immutable_levels_value_int != value->expected_n_immutable_levels) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Invalid integer value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname ");
      std::operator<<((ostream *)poVar2,"(expected: ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&value->expected_n_immutable_levels);
      poVar1 = &pMVar8->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," found: ");
      std::ostream::operator<<(poVar1,query_texture_immutable_levels_value_int);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid FP value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc55);
      goto LAB_00aa61a4;
    }
    fVar10 = query_texture_view_min_layer_value_float - (float)value->expected_n_min_layer;
    fVar9 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar9 = fVar10;
    }
    if (1e-05 < fVar9) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Invalid floating-point value reported for GL_TEXTURE_VIEW_MIN_LAYER pname ");
      std::operator<<((ostream *)poVar2,"(expected: ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&value->expected_n_min_layer);
      poVar1 = &pMVar8->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," found: ");
      std::ostream::operator<<(poVar1,query_texture_view_min_layer_value_float);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LAYER pname",(char *)0x0
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc60);
      goto LAB_00aa61a4;
    }
    if (query_texture_view_min_layer_value_int != value->expected_n_min_layer) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Invalid integer value reported for GL_TEXTURE_VIEW_MIN_LAYER pname ");
      std::operator<<((ostream *)poVar2,"(expected: ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&value->expected_n_min_layer);
      poVar1 = &pMVar8->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," found: ");
      std::ostream::operator<<(poVar1,query_texture_view_min_layer_value_int);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LAYER pname",(char *)0x0
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc6b);
      goto LAB_00aa61a4;
    }
    fVar10 = query_texture_view_min_level_value_float - (float)value->expected_n_min_level;
    fVar9 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar9 = fVar10;
    }
    if (1e-05 < fVar9) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Invalid floating-point value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname ");
      std::operator<<((ostream *)poVar2,"(expected: ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&value->expected_n_min_level);
      poVar1 = &pMVar8->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," found: ");
      std::ostream::operator<<(poVar1,query_texture_view_min_level_value_float);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname",(char *)0x0
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc76);
      goto LAB_00aa61a4;
    }
    if (query_texture_view_min_level_value_int != value->expected_n_min_level) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Invalid integer value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname ");
      std::operator<<((ostream *)poVar2,"(expected: ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&value->expected_n_min_level);
      poVar1 = &pMVar8->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," found: ");
      std::ostream::operator<<(poVar1,query_texture_view_min_level_value_int);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname",(char *)0x0
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc81);
      goto LAB_00aa61a4;
    }
    fVar10 = query_texture_view_num_layers_value_float - (float)value->expected_n_num_layers;
    fVar9 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar9 = fVar10;
    }
    if (1e-05 < fVar9) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Invalid floating-point value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname ")
      ;
      std::operator<<((ostream *)poVar2,"(expected: ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&value->expected_n_num_layers);
      poVar1 = &pMVar8->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," found: ");
      std::ostream::operator<<(poVar1,query_texture_view_num_layers_value_float);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc8c);
      goto LAB_00aa61a4;
    }
    if (query_texture_view_num_layers_value_int != value->expected_n_num_layers) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Invalid integer value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname ");
      std::operator<<((ostream *)poVar2,"(expected: ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&value->expected_n_num_layers);
      poVar1 = &pMVar8->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," found: ");
      std::ostream::operator<<(poVar1,query_texture_view_num_layers_value_int);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc97);
      goto LAB_00aa61a4;
    }
    fVar10 = query_texture_view_num_levels_value_float - (float)value->expected_n_num_levels;
    fVar9 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar9 = fVar10;
    }
    if (1e-05 < fVar9) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Invalid floating-point value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname ")
      ;
      std::operator<<((ostream *)poVar2,"(expected: ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&value->expected_n_num_levels);
      poVar1 = &pMVar8->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," found: ");
      std::ostream::operator<<(poVar1,query_texture_view_num_levels_value_float);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xca2);
      goto LAB_00aa61a4;
    }
    if (query_texture_view_num_levels_value_int != value->expected_n_num_levels) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Invalid integer value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname ");
      std::operator<<((ostream *)poVar2,"(expected: ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&value->expected_n_num_levels);
      poVar1 = &pMVar8->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," found: ");
      std::ostream::operator<<(poVar1,query_texture_view_num_levels_value_int);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xcad);
      goto LAB_00aa61a4;
    }
    value = value + 1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized texture type",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
             ,0xc0e);
LAB_00aa61a4:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult TextureViewTestGetTexParameter::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Make sure GL_ARB_texture_view is reported as supported before carrying on
	 * with actual execution */
	const std::vector<std::string>& extensions = m_context.getContextInfo().getExtensions();

	if (std::find(extensions.begin(), extensions.end(), "GL_ARB_texture_view") == extensions.end())
	{
		throw tcu::NotSupportedError("GL_ARB_texture_view is not supported");
	}

	/* Initialize all objects necessary to execute the test */
	initTestRuns();

	/* Iterate through all test runs and issue the queries */
	for (_test_runs_const_iterator test_run_iterator = m_test_runs.begin(); test_run_iterator != m_test_runs.end();
		 test_run_iterator++)
	{
		glw::GLfloat	 query_texture_immutable_levels_value_float = -1.0f;
		glw::GLint		 query_texture_immutable_levels_value_int   = -1;
		glw::GLfloat	 query_texture_view_min_layer_value_float   = -1.0f;
		glw::GLint		 query_texture_view_min_layer_value_int		= -1;
		glw::GLfloat	 query_texture_view_min_level_value_float   = -1.0f;
		glw::GLint		 query_texture_view_min_level_value_int		= -1;
		glw::GLfloat	 query_texture_view_num_layers_value_float  = -1.0f;
		glw::GLint		 query_texture_view_num_layers_value_int	= -1;
		glw::GLfloat	 query_texture_view_num_levels_value_float  = -1.0f;
		glw::GLint		 query_texture_view_num_levels_value_int	= -1;
		const _test_run& test_run									= *test_run_iterator;
		glw::GLint		 texture_object_id							= 0;

		switch (test_run.texture_type)
		{
		case TEST_TEXTURE_TYPE_IMMUTABLE_TEXTURE_OBJECT:
			texture_object_id = test_run.parent_texture_object_id;
			break;
		case TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT:
			texture_object_id = test_run.parent_texture_object_id;
			break;
		case TEST_TEXTURE_TYPE_NO_STORAGE_ALLOCATED:
			texture_object_id = test_run.parent_texture_object_id;
			break;
		case TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT:
			texture_object_id = test_run.texture_view_object_created_from_immutable_to_id;
			break;
		case TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW:
			texture_object_id = test_run.texture_view_object_created_from_view_to_id;
			break;

		default:
		{
			TCU_FAIL("Unrecognized texture type");
		}
		}

		/* Bind the texture object of our interest to the target */
		gl.bindTexture(test_run.texture_target, texture_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

		/* Run all the queries */
		gl.getTexParameterfv(test_run.texture_target, GL_TEXTURE_IMMUTABLE_LEVELS,
							 &query_texture_immutable_levels_value_float);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameterfv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname");

		gl.getTexParameteriv(test_run.texture_target, GL_TEXTURE_IMMUTABLE_LEVELS,
							 &query_texture_immutable_levels_value_int);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexPrameteriv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname");

		gl.getTexParameterfv(test_run.texture_target, GL_TEXTURE_VIEW_MIN_LAYER,
							 &query_texture_view_min_layer_value_float);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameterfv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname");

		gl.getTexParameteriv(test_run.texture_target, GL_TEXTURE_VIEW_MIN_LAYER,
							 &query_texture_view_min_layer_value_int);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname");

		gl.getTexParameterfv(test_run.texture_target, GL_TEXTURE_VIEW_MIN_LEVEL,
							 &query_texture_view_min_level_value_float);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameterfv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname");

		gl.getTexParameteriv(test_run.texture_target, GL_TEXTURE_VIEW_MIN_LEVEL,
							 &query_texture_view_min_level_value_int);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname");

		gl.getTexParameterfv(test_run.texture_target, GL_TEXTURE_VIEW_NUM_LAYERS,
							 &query_texture_view_num_layers_value_float);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameterfv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname");

		gl.getTexParameteriv(test_run.texture_target, GL_TEXTURE_VIEW_NUM_LAYERS,
							 &query_texture_view_num_layers_value_int);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname");

		gl.getTexParameterfv(test_run.texture_target, GL_TEXTURE_VIEW_NUM_LEVELS,
							 &query_texture_view_num_levels_value_float);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameterfv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname");

		gl.getTexParameteriv(test_run.texture_target, GL_TEXTURE_VIEW_NUM_LEVELS,
							 &query_texture_view_num_levels_value_int);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname");

		/* Verify the results */
		const float epsilon = 1e-5f;

		if (de::abs(query_texture_immutable_levels_value_float - (float)test_run.expected_n_immutable_levels) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid floating-point value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname "
							   << "(expected: " << test_run.expected_n_immutable_levels
							   << " found: " << query_texture_immutable_levels_value_float << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname");
		}

		if (query_texture_immutable_levels_value_int != test_run.expected_n_immutable_levels)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid integer value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname "
							   << "(expected: " << test_run.expected_n_immutable_levels
							   << " found: " << query_texture_immutable_levels_value_int << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname");
		}

		if (de::abs(query_texture_view_min_layer_value_float - (float)test_run.expected_n_min_layer) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid floating-point value reported for GL_TEXTURE_VIEW_MIN_LAYER pname "
							   << "(expected: " << test_run.expected_n_min_layer
							   << " found: " << query_texture_view_min_layer_value_float << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LAYER pname");
		}

		if (query_texture_view_min_layer_value_int != test_run.expected_n_min_layer)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid integer value reported for GL_TEXTURE_VIEW_MIN_LAYER pname "
							   << "(expected: " << test_run.expected_n_min_layer
							   << " found: " << query_texture_view_min_layer_value_int << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LAYER pname");
		}

		if (de::abs(query_texture_view_min_level_value_float - (float)test_run.expected_n_min_level) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid floating-point value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname "
							   << "(expected: " << test_run.expected_n_min_level
							   << " found: " << query_texture_view_min_level_value_float << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname");
		}

		if (query_texture_view_min_level_value_int != test_run.expected_n_min_level)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid integer value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname "
							   << "(expected: " << test_run.expected_n_min_level
							   << " found: " << query_texture_view_min_level_value_int << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname");
		}

		if (de::abs(query_texture_view_num_layers_value_float - (float)test_run.expected_n_num_layers) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid floating-point value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname "
							   << "(expected: " << test_run.expected_n_num_layers
							   << " found: " << query_texture_view_num_layers_value_float << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname");
		}

		if (query_texture_view_num_layers_value_int != test_run.expected_n_num_layers)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid integer value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname "
							   << "(expected: " << test_run.expected_n_num_layers
							   << " found: " << query_texture_view_num_layers_value_int << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname");
		}

		if (de::abs(query_texture_view_num_levels_value_float - (float)test_run.expected_n_num_levels) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid floating-point value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname "
							   << "(expected: " << test_run.expected_n_num_levels
							   << " found: " << query_texture_view_num_levels_value_float << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname");
		}

		if (query_texture_view_num_levels_value_int != test_run.expected_n_num_levels)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid integer value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname "
							   << "(expected: " << test_run.expected_n_num_levels
							   << " found: " << query_texture_view_num_levels_value_int << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname");
		}
	} /* for (all test runs) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}